

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall
mp::BasicSolver::UseOptionFile(BasicSolver *this,SolverOption *param_1,StringRef value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  Error *this_00;
  int *piVar4;
  char *pcVar5;
  char **in_R8;
  long lVar6;
  _Alloc_hider _Var7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  ifstream ifs;
  undefined1 auStack_298 [8];
  string local_290;
  BasicStringRef<char> local_270;
  undefined8 local_260;
  code *local_258;
  code *local_250;
  char *local_248;
  size_t local_240;
  long *local_238 [2];
  long local_228 [2];
  uint auStack_218 [122];
  
  local_240 = value.size_;
  pcVar5 = value.data_;
  pcVar8 = pcVar5 + local_240;
  local_248 = pcVar5;
  local_238[0] = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,pcVar5,pcVar8);
  std::__cxx11::string::operator=((string *)&this->option_file_save_,(string *)local_238);
  if (local_238[0] != local_228) {
    operator_delete(local_238[0],local_228[0] + 1);
  }
  paVar1 = &local_290.field_2;
  local_290._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,pcVar5,pcVar8);
  std::ifstream::ifstream(local_238,(string *)&local_290,_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != paVar1) {
    operator_delete(local_290._M_dataplus._M_p,
                    CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                             local_290.field_2._M_local_buf[0]) + 1);
  }
  if (*(int *)((long)auStack_218 + local_238[0][-3]) == 0) {
    local_260 = 0;
    local_250 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:856:32)>
                ::_M_invoke;
    local_258 = std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:856:32)>
                ::_M_manager;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    lVar6 = local_238[0][-3];
    local_290._M_dataplus._M_p = (pointer)paVar1;
    local_270.size_ = (size_t)this;
    if (*(int *)((long)auStack_218 + lVar6) == 0) {
      do {
        cVar2 = std::ios::widen((char)auStack_298 + (char)lVar6 + '`');
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_238,(string *)&local_290,cVar2);
        if (local_290._M_string_length != 0) {
          paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_290._M_dataplus._M_p + local_290._M_string_length);
          _Var7._M_p = local_290._M_dataplus._M_p;
          if (0 < (long)local_290._M_string_length >> 2) {
            _Var7._M_p = local_290._M_dataplus._M_p +
                         (local_290._M_string_length & 0xfffffffffffffffc);
            lVar6 = ((long)local_290._M_string_length >> 2) + 1;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(local_290._M_dataplus._M_p + 3);
            do {
              iVar3 = isspace((int)paVar9->_M_local_buf[-3]);
              if (iVar3 == 0) {
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar9->_M_local_buf + -3);
                goto LAB_00464890;
              }
              iVar3 = isspace((int)paVar9->_M_local_buf[-2]);
              if (iVar3 == 0) {
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar9->_M_local_buf + -2);
                goto LAB_00464890;
              }
              iVar3 = isspace((int)paVar9->_M_local_buf[-1]);
              if (iVar3 == 0) {
                paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(paVar9->_M_local_buf + -1);
                goto LAB_00464890;
              }
              iVar3 = isspace((int)paVar9->_M_local_buf[0]);
              if (iVar3 == 0) goto LAB_00464890;
              lVar6 = lVar6 + -1;
              paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar9->_M_local_buf + 4);
            } while (1 < lVar6);
          }
          lVar6 = (long)paVar1 - (long)_Var7._M_p;
          if (lVar6 == 1) {
LAB_0046486c:
            iVar3 = isspace((int)*_Var7._M_p);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var7._M_p;
            if (iVar3 != 0) {
              paVar9 = paVar1;
            }
          }
          else if (lVar6 == 2) {
LAB_0046485b:
            iVar3 = isspace((int)*_Var7._M_p);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var7._M_p;
            if (iVar3 != 0) {
              _Var7._M_p = _Var7._M_p + 1;
              goto LAB_0046486c;
            }
          }
          else {
            if (lVar6 != 3) goto LAB_004648ba;
            iVar3 = isspace((int)*_Var7._M_p);
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)_Var7._M_p;
            if (iVar3 != 0) {
              _Var7._M_p = _Var7._M_p + 1;
              goto LAB_0046485b;
            }
          }
LAB_00464890:
          if ((paVar1 != paVar9) && (paVar9->_M_local_buf[0] != '#')) {
            local_270.data_ = (char *)paVar9;
            if (local_258 == (code *)0x0) {
              std::__throw_bad_function_call();
            }
            (*local_250)(&local_270.size_,&local_270);
          }
        }
LAB_004648ba:
        lVar6 = local_238[0][-3];
      } while (*(int *)((long)auStack_218 + lVar6) == 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,
                        CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                 local_290.field_2._M_local_buf[0]) + 1);
      }
    }
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_270.size_,&local_270.size_,3);
    }
  }
  if ((char)((*(uint *)((long)auStack_218 + local_238[0][-3]) & 2) >> 1) == '\0' &&
      *(uint *)((long)auStack_218 + local_238[0][-3]) != 0) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    piVar4 = __errno_location();
    local_270.data_ = strerror(*piVar4);
    fmt::format<fmt::BasicStringRef<char>,char*>
              (&local_290,(fmt *)"Failed to read option file \'{}\': {}",(CStringRef)&local_248,
               &local_270,in_R8);
    Error::Error(this_00,(CStringRef)local_290._M_dataplus._M_p,-1);
    __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void BasicSolver::UseOptionFile(const SolverOption &, fmt::StringRef value) {
  option_file_save_ = value;
  std::ifstream ifs(value);
  if (ifs.good())
    ProcessLines_AvoidComments(ifs,
                               [this](const char* s)
    { ParseOptionString(s, option_flag_save_); });
  if (!ifs.good() && !ifs.eof())
    MP_RAISE(fmt::format("Failed to read option file '{}': {}",
                         value, std::strerror(errno)));
}